

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O3

spv_result_t spvtools::val::ImagePass(ValidationState_t *_,Instruction *inst)

{
  size_t *psVar1;
  ushort uVar2;
  uint16_t uVar3;
  spv_target_env sVar4;
  pointer puVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  spv_result_t sVar9;
  Op OVar10;
  Op OVar11;
  spv_result_t sVar12;
  StorageClass SVar13;
  uint id;
  uint32_t uVar14;
  uint32_t uVar15;
  int32_t iVar16;
  Function *pFVar17;
  _Node *p_Var18;
  _Node *p_Var19;
  Instruction *pIVar20;
  Instruction *this;
  long *plVar21;
  DiagnosticStream *pDVar22;
  uint uVar23;
  size_type *psVar24;
  Decoration decor;
  long lVar25;
  char *pcVar26;
  _Any_data *val;
  code *pcVar27;
  undefined8 uVar28;
  pointer ppIVar29;
  ImageTypeInfo info;
  ImageTypeInfo sampled_info;
  uint32_t actual_result_type;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> consumers;
  _Any_data local_2d8;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  _Any_data local_2b8;
  undefined8 local_2a8;
  undefined8 local_2a0;
  _Alloc_hider local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_288;
  undefined1 local_278 [464];
  spv_result_t local_a8;
  Function *local_a0;
  char *local_98;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> local_90;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  val = &local_2d8;
  uVar2 = (inst->inst_).opcode;
  OVar10 = CONCAT22(0,uVar2);
  bVar6 = anon_unknown_0::IsImplicitLod(OVar10);
  if (bVar6) {
    pFVar17 = ValidationState_t::function(_,inst->function_->id_);
    local_58._8_8_ = 0;
    local_58._2_6_ = 0;
    local_58._0_2_ = uVar2;
    local_40 = std::
               _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2328:44)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2328:44)>
               ::_M_manager;
    p_Var18 = std::__cxx11::
              list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
              ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                          *)&pFVar17->execution_model_limitations_,
                         (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_58);
    std::__detail::_List_node_base::_M_hook(&p_Var18->super__List_node_base);
    psVar1 = &(pFVar17->execution_model_limitations_).
              super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    pFVar17 = ValidationState_t::function(_,inst->function_->id_);
    local_78._8_8_ = 0;
    local_78._4_4_ = 0;
    local_78._0_4_ = OVar10;
    local_60 = std::
               _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2346:30)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2346:30)>
               ::_M_manager;
    p_Var19 = std::__cxx11::
              list<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>,std::allocator<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>>>
              ::
              _M_create_node<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>,std::allocator<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>>>
                          *)&pFVar17->limitations_,
                         (function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_78);
    std::__detail::_List_node_base::_M_hook(&p_Var19->super__List_node_base);
    psVar1 = &(pFVar17->limitations_).
              super__List_base<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  sVar9 = SPV_SUCCESS;
  sVar12 = SPV_SUCCESS;
  if (OVar10 != OpBuildNDRange && 0x12f < uVar2) {
    switch(OVar10) {
    case OpImageSparseSampleImplicitLod:
    case OpImageSparseSampleExplicitLod:
      goto switchD_00670eda_caseD_57;
    case OpImageSparseSampleDrefImplicitLod:
    case OpImageSparseSampleDrefExplicitLod:
      goto switchD_00670eda_caseD_59;
    case OpImageSparseSampleProjImplicitLod:
    case OpImageSparseSampleProjExplicitLod:
    case OpImageSparseSampleProjDrefImplicitLod:
    case OpImageSparseSampleProjDrefExplicitLod:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,
                 "Instruction reserved for future use, use of this instruction ",0x3d);
      pcVar26 = "is invalid";
LAB_00670faf:
      lVar25 = 10;
      goto LAB_00672aaa;
    case OpImageSparseFetch:
      goto switchD_00670eda_caseD_5f;
    case OpImageSparseGather:
    case OpImageSparseDrefGather:
      goto switchD_00670eda_caseD_60;
    case OpImageSparseTexelsResident:
      goto switchD_00670f7a_caseD_13c;
    case OpNoLine:
    case OpAtomicFlagTestAndSet:
    case OpAtomicFlagClear:
      goto switchD_00670eda_caseD_3d;
    case OpImageSparseRead:
      goto switchD_00670eda_caseD_62;
    default:
      if (0x17 < OVar10 - OpImageSampleWeightedQCOM) {
        return SPV_SUCCESS;
      }
      if ((0xf0000fU >> (OVar10 - OpImageSampleWeightedQCOM & 0x1f) & 1) == 0) {
        return SPV_SUCCESS;
      }
      uVar2 = (inst->inst_).opcode;
      uVar23 = uVar2 - 0x1182;
      if (uVar23 < 0x16) {
        if ((3U >> (uVar23 & 0x1f) & 1) == 0) {
          if ((0xc0000U >> (uVar23 & 0x1f) & 1) != 0) {
            iVar8 = Instruction::GetOperandAs<int>(inst,2);
            sVar9 = anon_unknown_0::ValidateImageProcessing2QCOMWindowDecoration(_,iVar8);
            if (sVar9 != SPV_SUCCESS) {
              return sVar9;
            }
            iVar8 = Instruction::GetOperandAs<int>(inst,4);
            sVar9 = anon_unknown_0::ValidateImageProcessing2QCOMWindowDecoration(_,iVar8);
            return sVar9;
          }
          if ((0x300000U >> (uVar23 & 0x1f) & 1) == 0) goto LAB_006717c9;
        }
        iVar8 = Instruction::GetOperandAs<int>(inst,2);
        sVar9 = anon_unknown_0::ValidateImageProcessingQCOMDecoration(_,iVar8,BlockMatchTextureQCOM)
        ;
        if (sVar9 != SPV_SUCCESS) {
          return sVar9;
        }
        iVar8 = Instruction::GetOperandAs<int>(inst,4);
        decor = BlockMatchTextureQCOM;
      }
      else {
LAB_006717c9:
        if (uVar2 != 0x1180) {
          return SPV_SUCCESS;
        }
        iVar8 = Instruction::GetOperandAs<int>(inst,4);
        decor = DecorationWeightTextureQCOM;
      }
      sVar12 = anon_unknown_0::ValidateImageProcessingQCOMDecoration(_,iVar8,decor);
      goto switchD_00670eda_caseD_3d;
    }
  }
  sVar12 = sVar9;
  switch(OVar10) {
  case OpImageTexelPointer:
    pIVar20 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    uVar3 = (pIVar20->inst_).opcode;
    if ((uVar3 == 0x20) || (uVar3 == 0x1141)) {
      SVar13 = Instruction::GetOperandAs<spv::StorageClass>(pIVar20,1);
      if (SVar13 == Image) {
        uVar23 = 0;
        if ((pIVar20->inst_).opcode == 0x20) {
          uVar23 = Instruction::GetOperandAs<unsigned_int>(pIVar20,2);
          OVar10 = ValidationState_t::GetIdOpcode(_,uVar23);
          if (((1 < OVar10 - OpTypeInt) && (OVar10 != OpTypeVoid)) &&
             ((OVar10 != OpTypeVector ||
              ((bVar6 = EnumSet<spv::Capability>::contains
                                  (&_->module_capabilities_,AtomicFloat16VectorNV), !bVar6 ||
               (bVar6 = ValidationState_t::IsFloat16Vector2Or4Type(_,uVar23), !bVar6)))))) {
            ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar26 = 
            "Expected Result Type to be a pointer whose Type operand must be a scalar numerical type or OpTypeVoid"
            ;
            lVar25 = 0x65;
            break;
          }
        }
        uVar14 = ValidationState_t::GetOperandTypeId(_,inst,2);
        this = ValidationState_t::FindDef(_,uVar14);
        if ((this == (Instruction *)0x0) || ((this->inst_).opcode != 0x20)) {
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar26 = "Expected Image to be OpTypePointer";
          lVar25 = 0x22;
        }
        else {
          id = Instruction::GetOperandAs<unsigned_int>(this,2);
          OVar10 = ValidationState_t::GetIdOpcode(_,id);
          if (OVar10 == OpTypeImage) {
            local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
            local_2d8._8_8_ = 0;
            uStack_2c8 = (code *)0x0;
            local_2c0 = (code *)0x7fffffff7fffffff;
            bVar6 = anon_unknown_0::GetImageTypeInfo(_,id,(ImageTypeInfo *)&local_2d8);
            if (!bVar6) goto LAB_00672a86;
            if (((pIVar20->inst_).opcode == 0x20) && (local_2d8._0_4_ != uVar23)) {
              bVar6 = EnumSet<spv::Capability>::contains
                                (&_->module_capabilities_,AtomicFloat16VectorNV);
              if ((bVar6) && (bVar6 = ValidationState_t::IsFloat16Vector2Or4Type(_,uVar23), bVar6))
              {
                OVar10 = ValidationState_t::GetIdOpcode(_,local_2d8._0_4_);
                if ((OVar10 == OpTypeFloat) &&
                   (((uVar14 = ValidationState_t::GetDimension(_,uVar23), uVar14 == 2 &&
                     ((int)local_2c0 == 7)) ||
                    ((uVar14 = ValidationState_t::GetDimension(_,uVar23), uVar14 == 4 &&
                     ((int)local_2c0 == 2)))))) goto LAB_00671b92;
              }
              ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar26 = 
              "Expected Image \'Sampled Type\' to be the same as the Type pointed to by Result Type"
              ;
              lVar25 = 0x52;
              break;
            }
LAB_00671b92:
            if (local_2d8._4_4_ == 0x104d) {
              ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar26 = "Image Dim TileImageDataEXT cannot be used with OpImageTexelPointer";
              goto LAB_00672693;
            }
            if (local_2d8._4_4_ == 6) {
              ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar26 = "Image Dim SubpassData cannot be used with OpImageTexelPointer";
              lVar25 = 0x3d;
              break;
            }
            uVar14 = ValidationState_t::GetOperandTypeId(_,inst,3);
            if ((uVar14 == 0) ||
               (bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14), !bVar6)) {
              ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar26 = "Expected Coordinate to be integer scalar or vector";
              goto LAB_00673c8f;
            }
            if (local_2d8._12_4_ == 1) {
              if (local_2d8._4_4_ == 0) {
                uVar15 = 2;
              }
              else {
                if ((local_2d8._4_4_ != 3) && (local_2d8._4_4_ != 1)) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar26 = 
                  "Expected Image \'Dim\' must be one of 1D, 2D, or Cube when Arrayed is 1";
                  lVar25 = 0x45;
                  break;
                }
                uVar15 = 3;
              }
            }
            else {
              uVar15 = 0;
              if (local_2d8._12_4_ == 0) {
                uVar15 = anon_unknown_0::GetPlaneCoordSize
                                   ((ImageTypeInfo *)(ulong)(uint)local_2d8._4_4_);
              }
            }
            uVar14 = ValidationState_t::GetDimension(_,uVar14);
            if (uVar15 == uVar14) {
              uVar14 = ValidationState_t::GetOperandTypeId(_,inst,4);
              if ((uVar14 == 0) || (bVar6 = ValidationState_t::IsIntScalarType(_,uVar14), !bVar6)) {
                ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar26 = "Expected Sample to be integer scalar";
                goto LAB_006723d6;
              }
              if ((uint)uStack_2c8 == 0) {
                local_2b8._M_unused._M_object = (_func_void *)0x0;
                uVar23 = Instruction::GetOperandAs<unsigned_int>(inst,4);
                bVar6 = ValidationState_t::EvalConstantValUint64
                                  (_,uVar23,(uint64_t *)local_2b8._M_pod_data);
                if ((!bVar6) || ((_func_void *)local_2b8._M_unused._0_8_ != (_func_void *)0x0)) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar26 = "Expected Sample for Image with MS 0 to be a valid <id> for the value 0"
                  ;
                  lVar25 = 0x46;
                  break;
                }
              }
              bVar6 = spvIsVulkanEnv(_->context_->target_env);
              if (!bVar6) {
                return SPV_SUCCESS;
              }
              if (((ulong)local_2c0 & 0xffffffff) < 0x2a) {
                if ((0x30201000008U >> ((ulong)local_2c0 & 0x3f) & 1) != 0) {
                  return SPV_SUCCESS;
                }
                if (((0x84UL >> ((ulong)local_2c0 & 0x3f) & 1) != 0) &&
                   (bVar6 = EnumSet<spv::Capability>::contains
                                      (&_->module_capabilities_,AtomicFloat16VectorNV), bVar6)) {
                  return SPV_SUCCESS;
                }
              }
              ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x1232,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
              pcVar26 = 
              "Expected the Image Format in Image to be R64i, R64ui, R32f, R32i, or R32ui for Vulkan environment"
              ;
              lVar25 = 0x61;
              goto LAB_006720e1;
            }
            ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_278,"Expected Coordinate to have ",0x1c);
            std::ostream::_M_insert<unsigned_long>((ulong)local_278);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_278," components, but given ",0x17);
            std::ostream::_M_insert<unsigned_long>((ulong)local_278);
            sVar12 = local_a8;
            goto LAB_00672abc;
          }
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar26 = "Expected Image to be OpTypePointer with Type OpTypeImage";
LAB_00671146:
          lVar25 = 0x38;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Expected Result Type to be a pointer whose Storage Class operand is Image";
        lVar25 = 0x49;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Expected Result Type to be a pointer";
LAB_006723d6:
      lVar25 = 0x24;
    }
    break;
  case OpLoad:
  case OpStore:
  case OpCopyMemory:
  case OpCopyMemorySized:
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
  case OpArrayLength:
  case OpGenericPtrMemSemantics:
  case OpInBoundsPtrAccessChain:
  case OpDecorate:
  case OpMemberDecorate:
  case OpDecorationGroup:
  case OpGroupDecorate:
  case OpGroupMemberDecorate:
  case OpMemberDecorate|OpSourceExtension:
  case OpVectorExtractDynamic:
  case OpVectorInsertDynamic:
  case OpVectorShuffle:
  case OpCompositeConstruct:
  case OpCompositeExtract:
  case OpCompositeInsert:
  case OpCopyObject:
  case OpTranspose:
  case OpTranspose|OpUndef:
    goto switchD_00670eda_caseD_3d;
  case OpSampledImage:
    pIVar20 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar20->inst_).opcode == 0x1b) {
      uVar14 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar10 = ValidationState_t::GetIdOpcode(_,uVar14);
      if (OVar10 != OpTypeImage) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Expected Image to be of type OpTypeImage.";
LAB_00672460:
        lVar25 = 0x29;
        break;
      }
      local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
      local_2d8._8_8_ = 0;
      uStack_2c8 = (code *)0x0;
      local_2c0 = (code *)0x7fffffff7fffffff;
      bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar14,(ImageTypeInfo *)&local_2d8);
      if (bVar6) {
        uVar23 = Instruction::GetOperandAs<unsigned_int>(pIVar20,1);
        if (uVar23 == uVar14) {
LAB_0067197f:
          bVar6 = spvIsVulkanEnv(_->context_->target_env);
          if (!bVar6) {
            if (1 < uStack_2c8._4_4_) {
              ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar26 = "Expected Image \'Sampled\' parameter to be 0 or 1";
              lVar25 = 0x2f;
              break;
            }
LAB_00672ded:
            if (local_2d8._4_4_ != 6) {
              uVar14 = ValidationState_t::GetOperandTypeId(_,inst,3);
              OVar10 = ValidationState_t::GetIdOpcode(_,uVar14);
              if (OVar10 == OpTypeSampler) {
                ValidationState_t::getSampledImageConsumers(&local_90,_,(inst->inst_).result_id);
                ppIVar29 = local_90.
                           super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                do {
                  if (ppIVar29 ==
                      local_90.
                      super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    uVar14 = Instruction::GetOperandAs<int>(inst,2);
                    pIVar20 = ValidationState_t::FindDef(_,uVar14);
                    sVar9 = SPV_SUCCESS;
                    if ((pIVar20->inst_).opcode == 0x3d) {
                      uVar14 = Instruction::GetOperandAs<int>(pIVar20,2);
                      ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                                (_,uVar14,pIVar20,inst);
                      sVar9 = SPV_SUCCESS;
                    }
LAB_00673f36:
                    if (local_90.
                        super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                      return sVar9;
                    }
                    operator_delete(local_90.
                                    super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_90.
                                          super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_90.
                                          super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                    return sVar9;
                  }
                  pIVar20 = *ppIVar29;
                  if (pIVar20->block_ != inst->block_) {
                    pDVar22 = (DiagnosticStream *)local_278;
                    ValidationState_t::diag(pDVar22,_,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22,
                               "All OpSampledImage instructions must be in the same block in which their Result <id> are consumed. OpSampledImage Result Type <id> "
                               ,0x83);
                    ValidationState_t::getIdName_abi_cxx11_
                              ((string *)&local_2b8,_,(inst->inst_).result_id);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_)
                    ;
                    pcVar26 = 
                    " has a consumer in a different basic block. The consumer instruction <id> is ";
                    lVar25 = 0x4d;
LAB_00673eb1:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22,pcVar26,lVar25);
                    ValidationState_t::getIdName_abi_cxx11_
                              ((string *)&local_298,_,(pIVar20->inst_).result_id);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22,local_298._M_p,local_290);
LAB_00673eeb:
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar22,".",1);
                    sVar9 = pDVar22->error_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_298._M_p != &aStack_288) {
                      operator_delete(local_298._M_p,aStack_288._M_allocated_capacity + 1);
                    }
                    if ((undefined8 *)local_2b8._M_unused._0_8_ != &local_2a8) {
                      operator_delete(local_2b8._M_unused._M_object,(ulong)(local_2a8 + 1));
                    }
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_278);
                    goto LAB_00673f36;
                  }
                  OVar10 = (Op)(pIVar20->inst_).opcode;
                  if ((OVar10 == OpPhi) || (OVar10 == OpSelect)) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,
                               "Result <id> from OpSampledImage instruction must not appear as operands of Op"
                               ,0x4d);
                    local_98 = spvOpcodeString(OVar10);
                    pDVar22 = DiagnosticStream::operator<<((DiagnosticStream *)local_278,&local_98);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar22,".",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22," Found result <id> ",0x13);
                    ValidationState_t::getIdName_abi_cxx11_
                              ((string *)&local_2b8,_,(inst->inst_).result_id);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22," as an operand of <id> ",0x17);
                    ValidationState_t::getIdName_abi_cxx11_
                              ((string *)&local_298,_,(pIVar20->inst_).result_id);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22,local_298._M_p,local_290);
                    goto LAB_00673eeb;
                  }
                  bVar6 = anon_unknown_0::IsAllowedSampledImageOperand(OVar10,_);
                  if (!bVar6) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,
                               "Result <id> from OpSampledImage instruction must not appear as operand for Op"
                               ,0x4d);
                    local_98 = spvOpcodeString(OVar10);
                    pDVar22 = DiagnosticStream::operator<<((DiagnosticStream *)local_278,&local_98);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22,", since it is not specified as taking an ",0x29);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22,"OpTypeSampledImage.",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22," Found result <id> ",0x13);
                    ValidationState_t::getIdName_abi_cxx11_
                              ((string *)&local_2b8,_,(inst->inst_).result_id);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar22,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_)
                    ;
                    pcVar26 = " as an operand of <id> ";
                    lVar25 = 0x17;
                    goto LAB_00673eb1;
                  }
                  ppIVar29 = ppIVar29 + 1;
                } while( true );
              }
              ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar26 = "Expected Sampler to be of type OpTypeSampler";
              goto LAB_00672384;
            }
            ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar26 = "Expected Image \'Dim\' parameter to be not SubpassData.";
            goto LAB_00672489;
          }
          if (uStack_2c8._4_4_ == 1) goto LAB_00672ded;
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x1a0f,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
          pcVar26 = "Expected Image \'Sampled\' parameter to be 1 for Vulkan environment.";
LAB_006719e3:
          lVar25 = 0x42;
          goto LAB_006720e1;
        }
        local_2b8._M_unused._M_member_pointer = 0x7fffffff00000000;
        local_2b8._8_8_ = 0;
        local_2a8 = (code *)0x0;
        local_2a0 = (code *)0x7fffffff7fffffff;
        bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar23,(ImageTypeInfo *)&local_2b8);
        if (bVar6) {
          if (local_2d8._0_4_ == local_2b8._0_4_) {
            if (local_2d8._4_4_ == local_2b8._4_4_) {
              if (local_2d8._12_4_ == local_2b8._12_4_) {
                if ((uint)uStack_2c8 == (int)local_2a8) {
                  if (uStack_2c8._4_4_ == local_2a8._4_4_) {
                    if ((int)local_2c0 == (int)local_2a0) {
                      if (local_2c0._4_4_ == local_2a0._4_4_) goto LAB_0067197f;
                    }
                  }
                }
              }
            }
          }
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar26 = "Image operands must match result image operands except for depth";
          lVar25 = 0x40;
          break;
        }
      }
LAB_00672a86:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Corrupt image type definition";
      lVar25 = 0x1d;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Expected Result Type to be OpTypeSampledImage.";
LAB_00672337:
      lVar25 = 0x2e;
    }
    break;
  case OpImageSampleImplicitLod:
  case OpImageSampleExplicitLod:
  case OpImageSampleProjImplicitLod:
  case OpImageSampleProjExplicitLod:
switchD_00670eda_caseD_57:
    uVar2 = (inst->inst_).opcode;
    OVar10 = (Op)uVar2;
    local_298._M_p = (pointer)((ulong)local_298._M_p._4_4_ << 0x20);
    sVar9 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&local_298);
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    uVar14 = (uint32_t)local_298._M_p;
    bVar6 = ValidationState_t::IsIntVectorType(_,(uint32_t)local_298._M_p);
    if ((bVar6) || (bVar6 = ValidationState_t::IsFloatVectorType(_,uVar14), bVar6)) {
      uVar15 = ValidationState_t::GetDimension(_,uVar14);
      if (uVar15 != 4) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Expected ",9);
        uVar23 = OVar10 - OpImageSparseSampleImplicitLod;
        if ((ushort)uVar23 < 0x10) goto LAB_00672186;
LAB_00672193:
        pcVar26 = "Result Type";
LAB_0067219d:
        *(char **)val = pcVar26;
        pDVar22 = DiagnosticStream::operator<<((DiagnosticStream *)local_278,(char **)val);
        pcVar26 = " to have 4 components";
        lVar25 = 0x15;
        goto LAB_00672409;
      }
      uVar15 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar11 = ValidationState_t::GetIdOpcode(_,uVar15);
      if (OVar11 != OpTypeSampledImage) goto LAB_006717f7;
      local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
      local_2d8._8_8_ = 0;
      uStack_2c8 = (code *)0x0;
      local_2c0 = (code *)0x7fffffff7fffffff;
      bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar15,(ImageTypeInfo *)&local_2d8);
      if (!bVar6) goto LAB_00672a86;
      bVar6 = anon_unknown_0::IsProj(OVar10);
      if ((bVar6) &&
         (sVar9 = anon_unknown_0::ValidateImageProj(_,inst,(ImageTypeInfo *)&local_2d8),
         sVar9 != SPV_SUCCESS)) {
        return sVar9;
      }
      if ((uint)uStack_2c8 != 0) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Sampling operation is invalid for multisample image";
        lVar25 = 0x33;
        break;
      }
      OVar11 = ValidationState_t::GetIdOpcode(_,local_2d8._0_4_);
      if (OVar11 == OpTypeVoid) {
LAB_00672bc0:
        uVar14 = ValidationState_t::GetOperandTypeId(_,inst,3);
        if (((uVar2 == 0x132) || (OVar10 == OpImageSampleExplicitLod)) &&
           (bVar6 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel),
           bVar6)) {
          bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar14);
          if ((!bVar6) && (bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14), !bVar6))
          goto LAB_00672e6f;
        }
        else {
          bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar14);
          if (!bVar6) goto LAB_00673329;
        }
        uVar15 = anon_unknown_0::GetMinCoordSize(OVar10,(ImageTypeInfo *)&local_2d8);
        uVar14 = ValidationState_t::GetDimension(_,uVar14);
        if (uVar14 < uVar15) goto LAB_006736c1;
        puVar5 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((0x17 < (ulong)((long)(inst->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar5)) &&
            ((puVar5[5] & 8) != 0)) &&
           ((bVar6 = spvIsOpenCLEnv(_->context_->target_env), OVar10 == OpImageSampleExplicitLod &&
            (bVar6)))) goto LAB_006734cd;
        goto LAB_00673cce;
      }
      uVar14 = ValidationState_t::GetComponentType(_,uVar14);
      if (uVar14 == local_2d8._0_4_) goto LAB_00672bc0;
LAB_00673741:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"Expected Image \'Sampled Type\' to be the same as ",0x30);
      uVar23 = OVar10 - OpImageSparseSampleImplicitLod;
      if (0xf < (ushort)uVar23) goto LAB_0067378c;
LAB_0067377f:
      local_2b8._M_unused._M_object = (&PTR_anon_var_dwarf_2d18a9b_0098ab30)[uVar23 & 0xffff];
LAB_00673793:
      pDVar22 = DiagnosticStream::operator<<((DiagnosticStream *)local_278,(char **)&local_2b8);
      pcVar26 = " components";
      lVar25 = 0xb;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Expected ",9);
      uVar23 = OVar10 - OpImageSparseSampleImplicitLod;
      if (0xf < (ushort)uVar23) goto LAB_006722a2;
LAB_00672295:
      local_2d8._M_unused._M_object = (&PTR_anon_var_dwarf_2d18a9b_0098ab30)[uVar23 & 0xffff];
LAB_006722a9:
      pDVar22 = DiagnosticStream::operator<<((DiagnosticStream *)local_278,(char **)&local_2d8);
      pcVar26 = " to be int or float vector type";
LAB_00672404:
      lVar25 = 0x1f;
    }
LAB_00672409:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar22,pcVar26,lVar25);
    sVar12 = pDVar22->error_;
    goto LAB_00672abc;
  case OpImageSampleDrefImplicitLod:
  case OpImageSampleDrefExplicitLod:
  case OpImageSampleProjDrefImplicitLod:
  case OpImageSampleProjDrefExplicitLod:
switchD_00670eda_caseD_59:
    OVar10 = (Op)(inst->inst_).opcode;
    local_298._M_p = (pointer)((ulong)local_298._M_p._4_4_ << 0x20);
    sVar9 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&local_298);
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    uVar14 = (uint32_t)local_298._M_p;
    bVar6 = ValidationState_t::IsIntScalarType(_,(uint32_t)local_298._M_p);
    if ((!bVar6) && (bVar6 = ValidationState_t::IsFloatScalarType(_,uVar14), !bVar6)) {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Expected ",9);
      if ((ushort)(OVar10 - OpImageSparseSampleImplicitLod) < 0x10) {
        local_2d8._M_unused._M_object =
             (&PTR_anon_var_dwarf_2d18a9b_0098ab30)
             [OVar10 - OpImageSparseSampleImplicitLod & 0xffff];
      }
      else {
        local_2d8._M_unused._M_object = "Result Type";
      }
      pDVar22 = DiagnosticStream::operator<<((DiagnosticStream *)local_278,(char **)&local_2d8);
      pcVar26 = " to be int or float scalar type";
      goto LAB_00672404;
    }
    uVar15 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar11 = ValidationState_t::GetIdOpcode(_,uVar15);
    if (OVar11 == OpTypeSampledImage) {
      local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
      local_2d8._8_8_ = 0;
      uStack_2c8 = (code *)0x0;
      local_2c0 = (code *)0x7fffffff7fffffff;
      bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar15,(ImageTypeInfo *)&local_2d8);
      if (!bVar6) goto LAB_00672a86;
      bVar6 = anon_unknown_0::IsProj(OVar10);
      if ((bVar6) &&
         (sVar9 = anon_unknown_0::ValidateImageProj(_,inst,(ImageTypeInfo *)&local_2d8),
         sVar9 != SPV_SUCCESS)) {
        return sVar9;
      }
      if ((uint)uStack_2c8 != 0) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Dref sampling operation is invalid for multisample image";
        goto LAB_00671146;
      }
      if (uVar14 != local_2d8._0_4_) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Expected Image \'Sampled Type\' to be the same as ",0x30);
        if ((ushort)(OVar10 - OpImageSparseSampleImplicitLod) < 0x10) {
          local_2b8._M_unused._M_object =
               (&PTR_anon_var_dwarf_2d18a9b_0098ab30)
               [OVar10 - OpImageSparseSampleImplicitLod & 0xffff];
        }
        else {
          local_2b8._M_unused._M_object = "Result Type";
        }
        pDVar22 = DiagnosticStream::operator<<((DiagnosticStream *)local_278,(char **)&local_2b8);
        sVar12 = pDVar22->error_;
        goto LAB_00672abc;
      }
      uVar14 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar14);
      if (!bVar6) goto LAB_00673329;
      uVar15 = anon_unknown_0::GetMinCoordSize(OVar10,(ImageTypeInfo *)&local_2d8);
      uVar14 = ValidationState_t::GetDimension(_,uVar14);
      if (uVar14 < uVar15) goto LAB_006736c1;
      sVar9 = anon_unknown_0::ValidateImageDref(_,inst,(ImageTypeInfo *)&local_2d8);
joined_r0x00673aa4:
      if (sVar9 != SPV_SUCCESS) {
        return sVar9;
      }
      goto LAB_00672702;
    }
LAB_006717f7:
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar26 = "Expected Sampled Image to be of type OpTypeSampledImage";
LAB_00671816:
    lVar25 = 0x37;
    break;
  case OpImageFetch:
switchD_00670eda_caseD_5f:
    local_298._M_p = (pointer)((ulong)local_298._M_p._4_4_ << 0x20);
    sVar9 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&local_298);
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    OVar10 = (Op)(inst->inst_).opcode;
    uVar14 = (uint32_t)local_298._M_p;
    bVar6 = ValidationState_t::IsIntVectorType(_,(uint32_t)local_298._M_p);
    if ((!bVar6) && (bVar6 = ValidationState_t::IsFloatVectorType(_,uVar14), !bVar6)) {
LAB_006721c1:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Expected ",9);
      uVar23 = OVar10 - OpImageSparseSampleImplicitLod;
      if ((ushort)uVar23 < 0x10) goto LAB_00672295;
LAB_006722a2:
      local_2d8._M_unused._M_object = "Result Type";
      goto LAB_006722a9;
    }
    uVar15 = ValidationState_t::GetDimension(_,uVar14);
    if (uVar15 != 4) {
LAB_0067210b:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Expected ",9);
      uVar23 = OVar10 - OpImageSparseSampleImplicitLod;
      if (0xf < (ushort)uVar23) goto LAB_00672193;
LAB_00672186:
      pcVar26 = (&PTR_anon_var_dwarf_2d18a9b_0098ab30)[uVar23 & 0xffff];
      val = &local_2d8;
      goto LAB_0067219d;
    }
    uVar15 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar11 = ValidationState_t::GetIdOpcode(_,uVar15);
    if (OVar11 != OpTypeImage) goto LAB_00671f4d;
    local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2d8._8_8_ = 0;
    uStack_2c8 = (code *)0x0;
    local_2c0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar15,(ImageTypeInfo *)&local_2d8);
    if (!bVar6) goto LAB_00672a86;
    OVar11 = ValidationState_t::GetIdOpcode(_,local_2d8._0_4_);
    if (OVar11 != OpTypeVoid) {
      uVar14 = ValidationState_t::GetComponentType(_,uVar14);
      if (uVar14 != local_2d8._0_4_) {
LAB_00672d7b:
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Expected Image \'Sampled Type\' to be the same as ",0x30);
        uVar23 = OVar10 - OpImageSparseSampleImplicitLod;
        if ((ushort)uVar23 < 0x10) goto LAB_0067377f;
LAB_0067378c:
        local_2b8._M_unused._M_object = "Result Type";
        goto LAB_00673793;
      }
    }
    if (local_2d8._4_4_ != 3) {
      if (uStack_2c8._4_4_ != 1) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Expected Image \'Sampled\' parameter to be 1";
        goto LAB_0067178b;
      }
      uVar14 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14);
      if (!bVar6) {
LAB_0067371d:
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Expected Coordinate to be int scalar or vector";
        goto LAB_00672337;
      }
      uVar15 = anon_unknown_0::GetMinCoordSize(OVar10,(ImageTypeInfo *)&local_2d8);
      uVar14 = ValidationState_t::GetDimension(_,uVar14);
      if (uVar15 <= uVar14) {
LAB_00673cce:
        uVar14 = 6;
LAB_00673cdc:
        sVar9 = anon_unknown_0::ValidateImageOperands(_,inst,(ImageTypeInfo *)&local_2d8,uVar14);
        return sVar9;
      }
      goto LAB_006736c1;
    }
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar26 = "Image \'Dim\' cannot be Cube";
LAB_00673500:
    lVar25 = 0x1a;
    break;
  case OpImageGather:
  case OpImageDrefGather:
switchD_00670eda_caseD_60:
    local_298._M_p = (pointer)((ulong)local_298._M_p._4_4_ << 0x20);
    sVar9 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&local_298);
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    uVar2 = (inst->inst_).opcode;
    OVar10 = (Op)uVar2;
    uVar14 = (uint32_t)local_298._M_p;
    bVar6 = ValidationState_t::IsIntVectorType(_,(uint32_t)local_298._M_p);
    if ((!bVar6) && (bVar6 = ValidationState_t::IsFloatVectorType(_,uVar14), !bVar6))
    goto LAB_006721c1;
    uVar15 = ValidationState_t::GetDimension(_,uVar14);
    if (uVar15 != 4) goto LAB_0067210b;
    uVar15 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar11 = ValidationState_t::GetIdOpcode(_,uVar15);
    if (OVar11 != OpTypeSampledImage) goto LAB_006717f7;
    local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2d8._8_8_ = 0;
    uStack_2c8 = (code *)0x0;
    local_2c0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar15,(ImageTypeInfo *)&local_2d8);
    if (!bVar6) goto LAB_00672a86;
    if ((uint)uStack_2c8 != 0) {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Gather operation is invalid for multisample image";
      lVar25 = 0x31;
      break;
    }
    if ((uVar2 == 0x61) || (uVar2 == 0x13b)) {
LAB_00672c69:
      uVar14 = ValidationState_t::GetComponentType(_,uVar14);
      if (uVar14 != local_2d8._0_4_) goto LAB_00672d7b;
    }
    else {
      OVar11 = ValidationState_t::GetIdOpcode(_,local_2d8._0_4_);
      if (OVar11 != OpTypeVoid) goto LAB_00672c69;
    }
    if (((uint)local_2d8._4_4_ < 5) && ((0x1aU >> (local_2d8._4_4_ & 0x1f) & 1) != 0)) {
      uVar14 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar14);
      if (!bVar6) {
LAB_00673329:
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Expected Coordinate to be float scalar or vector";
        lVar25 = 0x30;
        break;
      }
      OVar10 = (Op)uVar2;
      uVar15 = anon_unknown_0::GetMinCoordSize(OVar10,(ImageTypeInfo *)&local_2d8);
      uVar14 = ValidationState_t::GetDimension(_,uVar14);
      if (uVar15 <= uVar14) {
        if (OVar10 < OpImageSparseGather) {
          if (uVar2 != 0x60) {
            if (uVar2 != 0x61) {
LAB_0067444c:
              __assert_fail("opcode == spv::Op::OpImageDrefGather || opcode == spv::Op::OpImageSparseDrefGather"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                            ,0x65c,
                            "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageGather(ValidationState_t &, const Instruction *)"
                           );
            }
LAB_00673a92:
            sVar9 = anon_unknown_0::ValidateImageDref(_,inst,(ImageTypeInfo *)&local_2d8);
            goto joined_r0x00673aa4;
          }
        }
        else {
          if (OVar10 == OpImageSparseDrefGather) goto LAB_00673a92;
          if (OVar10 != OpImageSparseGather) goto LAB_0067444c;
        }
        uVar23 = Instruction::GetOperandAs<unsigned_int>(inst,4);
        uVar14 = ValidationState_t::GetTypeId(_,uVar23);
        bVar6 = ValidationState_t::IsIntScalarType(_,uVar14);
        if ((bVar6) && (uVar14 = ValidationState_t::GetBitWidth(_,uVar14), uVar14 == 0x20)) {
          bVar6 = spvIsVulkanEnv(_->context_->target_env);
          if (bVar6) {
            OVar10 = ValidationState_t::GetIdOpcode(_,uVar23);
            iVar16 = spvOpcodeIsConstant(OVar10);
            if (iVar16 == 0) {
              ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x1238,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
              pcVar26 = "Expected Component Operand to be a const object for Vulkan environment";
              lVar25 = 0x46;
              goto LAB_006720e1;
            }
          }
LAB_00672702:
          uVar14 = 7;
          goto LAB_00673cdc;
        }
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Expected Component to be 32-bit int scalar";
        goto LAB_0067178b;
      }
LAB_006732d3:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"Expected Coordinate to have at least ",0x25);
      std::ostream::_M_insert<unsigned_long>((ulong)local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278," components, but given only ",0x1c);
      goto LAB_00673710;
    }
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x12a9,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
    pcVar26 = "Expected Image \'Dim\' to be 2D, Cube, or Rect";
    lVar25 = 0x2c;
    goto LAB_006720e1;
  case OpImageRead:
switchD_00670eda_caseD_62:
    OVar10 = (Op)(inst->inst_).opcode;
    local_298._M_p = (pointer)((ulong)local_298._M_p._4_4_ << 0x20);
    sVar9 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&local_298);
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    uVar14 = (uint32_t)local_298._M_p;
    bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,(uint32_t)local_298._M_p);
    if ((!bVar6) && (bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar14), !bVar6)) {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Expected ",9);
      if ((ushort)(OVar10 - OpImageSparseSampleImplicitLod) < 0x10) {
        local_2d8._M_unused._M_object =
             (&PTR_anon_var_dwarf_2d18a9b_0098ab30)
             [OVar10 - OpImageSparseSampleImplicitLod & 0xffff];
      }
      else {
        local_2d8._M_unused._M_object = "Result Type";
      }
      pDVar22 = DiagnosticStream::operator<<((DiagnosticStream *)local_278,(char **)&local_2d8);
      pcVar26 = " to be int or float scalar or vector type";
      lVar25 = 0x29;
      goto LAB_00672409;
    }
    sVar4 = _->context_->target_env;
    bVar6 = spvIsVulkanEnv(sVar4);
    if ((!bVar6) || (uVar15 = ValidationState_t::GetDimension(_,uVar14), uVar15 == 4)) {
      uVar15 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar11 = ValidationState_t::GetIdOpcode(_,uVar15);
      if (OVar11 != OpTypeImage) goto LAB_00671f4d;
      local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
      local_2d8._8_8_ = 0;
      uStack_2c8 = (code *)0x0;
      local_2c0 = (code *)0x7fffffff7fffffff;
      bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar15,(ImageTypeInfo *)&local_2d8);
      if (!bVar6) goto LAB_00672a86;
      bVar6 = spvIsOpenCLEnv(sVar4);
      if (bVar6) {
        if (local_2d8._8_4_ == 0) {
          uVar15 = ValidationState_t::GetDimension(_,uVar14);
          if (uVar15 != 4) {
            ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Expected ",9);
            if ((ushort)(OVar10 - OpImageSparseSampleImplicitLod) < 0x10) {
              pcVar26 = (&PTR_anon_var_dwarf_2d18a9b_0098ab30)
                        [OVar10 - OpImageSparseSampleImplicitLod & 0xffff];
            }
            else {
              pcVar26 = "Result Type";
            }
            val = &local_2b8;
            goto LAB_0067219d;
          }
        }
        else {
          bVar6 = ValidationState_t::IsFloatScalarType(_,uVar14);
          if (!bVar6) {
            ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Expected ",9);
            if ((ushort)(OVar10 - OpImageSparseSampleImplicitLod) < 0x10) {
              local_2b8._M_unused._M_object =
                   (&PTR_anon_var_dwarf_2d18a9b_0098ab30)
                   [OVar10 - OpImageSparseSampleImplicitLod & 0xffff];
            }
            else {
              local_2b8._M_unused._M_object = "Result Type";
            }
            pDVar22 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_278,(char **)&local_2b8);
            pcVar26 = " from a depth image read to result in a scalar float value";
            lVar25 = 0x3a;
            goto LAB_00672409;
          }
        }
        puVar5 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((ulong)((long)(inst->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar5) < 0x18) ||
           ((puVar5[5] & 8) == 0)) goto LAB_0067306d;
LAB_006734cd:
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"ConstOffset image operand not allowed ",0x26);
        pcVar26 = "in the OpenCL environment.";
        goto LAB_00673500;
      }
LAB_0067306d:
      if (local_2d8._4_4_ == 6) {
        if (OVar10 == OpImageSparseRead) {
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar26 = "Image Dim SubpassData cannot be used with ImageSparseRead";
          lVar25 = 0x39;
          break;
        }
        local_a0 = ValidationState_t::function(_,inst->function_->id_);
        local_2b8._M_unused._M_object = &local_2a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b8,"Dim SubpassData requires Fragment execution model: ","");
        spvOpcodeString(OVar10);
        plVar21 = (long *)std::__cxx11::string::append(local_2b8._M_pod_data);
        psVar24 = (size_type *)(plVar21 + 2);
        if ((size_type *)*plVar21 == psVar24) {
          local_278._16_8_ = *psVar24;
          local_278._24_8_ = plVar21[3];
          local_278._0_8_ = local_278 + 0x10;
        }
        else {
          local_278._16_8_ = *psVar24;
          local_278._0_8_ = (size_type *)*plVar21;
        }
        local_278._8_8_ = plVar21[1];
        *plVar21 = (long)psVar24;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        Function::RegisterExecutionModelLimitation
                  (local_a0,ExecutionModelFragment,(string *)local_278);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        if ((undefined8 *)local_2b8._M_unused._0_8_ != &local_2a8) {
          operator_delete(local_2b8._M_unused._M_object,(ulong)(local_2a8 + 1));
        }
      }
      if (local_2d8._4_4_ != 0x104d) {
        OVar11 = ValidationState_t::GetIdOpcode(_,local_2d8._0_4_);
        if (OVar11 != OpTypeVoid) {
          uVar14 = ValidationState_t::GetComponentType(_,uVar14);
          if (uVar14 != local_2d8._0_4_) goto LAB_00673741;
        }
        sVar9 = anon_unknown_0::ValidateImageReadWrite(_,inst,(ImageTypeInfo *)&local_2d8);
        if (sVar9 != SPV_SUCCESS) {
          return sVar9;
        }
        uVar14 = ValidationState_t::GetOperandTypeId(_,inst,3);
        bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14);
        if (!bVar6) goto LAB_0067371d;
        uVar15 = anon_unknown_0::GetMinCoordSize(OVar10,(ImageTypeInfo *)&local_2d8);
        uVar14 = ValidationState_t::GetDimension(_,uVar14);
        if (uVar14 < uVar15) goto LAB_006736c1;
        bVar6 = spvIsVulkanEnv(_->context_->target_env);
        if ((((!bVar6) || ((int)local_2c0 != 0)) || (local_2d8._4_4_ == 6)) ||
           (bVar6 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityStorageImageReadWithoutFormat),
           bVar6)) goto LAB_00673cce;
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Capability StorageImageReadWithoutFormat is required to ",
                   0x38);
        pcVar26 = "read storage image";
        lVar25 = 0x12;
        break;
      }
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"Image Dim TileImageDataEXT cannot be used with ",0x2f);
      local_2b8._M_unused._0_8_ = (undefined8)spvOpcodeString(OVar10);
      pDVar22 = DiagnosticStream::operator<<((DiagnosticStream *)local_278,(char **)&local_2b8);
      sVar12 = pDVar22->error_;
      goto LAB_00672abc;
    }
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2d8,_,0x12ac,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Expected ",9);
    if ((ushort)(OVar10 - OpImageSparseSampleImplicitLod) < 0x10) {
      local_2b8._M_unused._M_object =
           (&PTR_anon_var_dwarf_2d18a9b_0098ab30)[OVar10 - OpImageSparseSampleImplicitLod & 0xffff];
    }
    else {
      local_2b8._M_unused._M_object = "Result Type";
    }
    pDVar22 = DiagnosticStream::operator<<((DiagnosticStream *)local_278,(char **)&local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar22," to have 4 components",0x15);
    pcVar27 = uStack_2c8;
    uVar28 = local_2d8._M_unused._0_8_;
    sVar12 = pDVar22->error_;
    local_a8 = pDVar22->error_;
    if ((undefined8 *)local_2d8._M_unused._0_8_ == &uStack_2c8) goto LAB_00672abc;
    goto LAB_006729e4;
  case OpImageWrite:
    uVar14 = ValidationState_t::GetOperandTypeId(_,inst,0);
    OVar10 = ValidationState_t::GetIdOpcode(_,uVar14);
    if (OVar10 != OpTypeImage) {
LAB_00671f4d:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Expected Image to be of type OpTypeImage";
      lVar25 = 0x28;
      break;
    }
    local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2d8._8_8_ = 0;
    uStack_2c8 = (code *)0x0;
    local_2c0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar14,(ImageTypeInfo *)&local_2d8);
    if (!bVar6) goto LAB_00672a86;
    if (local_2d8._4_4_ == 0x104d) {
LAB_00672493:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Image \'Dim\' cannot be TileImageDataEXT";
      goto LAB_006724b2;
    }
    if (local_2d8._4_4_ == 6) {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Image \'Dim\' cannot be SubpassData";
      lVar25 = 0x21;
      break;
    }
    sVar9 = anon_unknown_0::ValidateImageReadWrite(_,inst,(ImageTypeInfo *)&local_2d8);
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    uVar14 = ValidationState_t::GetOperandTypeId(_,inst,1);
    bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14);
    if (!bVar6) goto LAB_0067371d;
    uVar15 = anon_unknown_0::GetMinCoordSize((uint)(inst->inst_).opcode,(ImageTypeInfo *)&local_2d8)
    ;
    uVar14 = ValidationState_t::GetDimension(_,uVar14);
    if (uVar15 <= uVar14) {
      uVar14 = ValidationState_t::GetOperandTypeId(_,inst,2);
      bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14);
      if ((bVar6) || (bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar14), bVar6)) {
        OVar10 = ValidationState_t::GetIdOpcode(_,local_2d8._0_4_);
        if (OVar10 != OpTypeVoid) {
          uVar14 = ValidationState_t::GetComponentType(_,uVar14);
          if (uVar14 != local_2d8._0_4_) {
            ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_278,
                       "Expected Image \'Sampled Type\' to be the same as Texel ",0x36);
            pcVar26 = "components";
            goto LAB_00670faf;
          }
        }
        bVar6 = spvIsVulkanEnv(_->context_->target_env);
        if ((((!bVar6) || ((int)local_2c0 != 0)) || (local_2d8._4_4_ == 6)) ||
           (bVar6 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityStorageImageWriteWithoutFormat),
           bVar6)) {
          if (((ulong)((long)(inst->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) < 0x11) ||
             (bVar6 = spvIsOpenCLEnv(_->context_->target_env), !bVar6)) {
            uVar14 = 5;
            goto LAB_00673cdc;
          }
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"Optional Image Operands are not allowed in the OpenCL ",
                     0x36);
          pcVar26 = "environment.";
          lVar25 = 0xc;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,
                     "Capability StorageImageWriteWithoutFormat is required to write ",0x3f);
          pcVar26 = "to storage image";
          lVar25 = 0x10;
        }
        break;
      }
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Expected Texel to be int or float vector or scalar";
LAB_00673c8f:
      lVar25 = 0x32;
      break;
    }
LAB_006736c1:
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"Expected Coordinate to have at least ",0x25);
    std::ostream::_M_insert<unsigned_long>((ulong)local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278," components, but given only ",0x1c);
LAB_00673710:
    std::ostream::_M_insert<unsigned_long>((ulong)local_278);
    sVar12 = local_a8;
    goto LAB_00672abc;
  case OpImage:
    uVar14 = (inst->inst_).type_id;
    OVar10 = ValidationState_t::GetIdOpcode(_,uVar14);
    if (OVar10 != OpTypeImage) {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Expected Result Type to be OpTypeImage";
LAB_006724b2:
      lVar25 = 0x26;
      break;
    }
    uVar15 = ValidationState_t::GetOperandTypeId(_,inst,2);
    pIVar20 = ValidationState_t::FindDef(_,uVar15);
    if (pIVar20 == (Instruction *)0x0) {
      __assert_fail("sampled_image_type_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                    ,0x745,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateImage(ValidationState_t &, const Instruction *)"
                   );
    }
    if ((pIVar20->inst_).opcode == 0x1b) {
      if ((pIVar20->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[2] == uVar14) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Expected Sample Image image type to be equal to Result Type";
LAB_0067315d:
      lVar25 = 0x3b;
      break;
    }
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar26 = "Expected Sample Image to be of type OpTypeSampleImage";
LAB_00672489:
    lVar25 = 0x35;
    break;
  case OpImageQueryFormat:
  case OpImageQueryOrder:
    bVar6 = ValidationState_t::IsIntScalarType(_,(inst->inst_).type_id);
    if (bVar6) {
      uVar14 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar10 = ValidationState_t::GetIdOpcode(_,uVar14);
      if (OVar10 == OpTypeImage) {
        local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
        local_2d8._8_8_ = 0;
        uStack_2c8 = (code *)0x0;
        local_2c0 = (code *)0x7fffffff7fffffff;
        bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar14,(ImageTypeInfo *)&local_2d8);
        if (bVar6) {
          if (local_2d8._4_4_ != 0x104d) {
            return SPV_SUCCESS;
          }
          goto LAB_00672493;
        }
        goto LAB_00672a86;
      }
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Expected operand to be of type OpTypeImage";
    }
    else {
LAB_0067176c:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Expected Result Type to be int scalar type";
    }
LAB_0067178b:
    lVar25 = 0x2a;
    break;
  case OpImageQuerySizeLod:
    uVar14 = (inst->inst_).type_id;
    bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14);
    if (!bVar6) {
LAB_00671f76:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Expected Result Type to be int scalar or vector type";
LAB_00671f95:
      lVar25 = 0x34;
      break;
    }
    uVar15 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar10 = ValidationState_t::GetIdOpcode(_,uVar15);
    if (OVar10 != OpTypeImage) goto LAB_00671f4d;
    local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2d8._8_8_ = 0;
    uStack_2c8 = (code *)0x0;
    local_2c0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar15,(ImageTypeInfo *)&local_2d8);
    if (!bVar6) goto LAB_00672a86;
    if (3 < local_2d8._M_unused._M_member_pointer >> 0x20) {
LAB_00671df6:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Image \'Dim\' must be 1D, 2D, 3D or Cube";
      goto LAB_006724b2;
    }
    if ((uint)uStack_2c8 == 0) {
      uVar15 = *(int *)(&DAT_007ad600 + (local_2d8._M_unused._M_member_pointer >> 0x20) * 4) +
               local_2d8._12_4_;
      bVar6 = spvIsVulkanEnv(_->context_->target_env);
      if ((bVar6) && (uStack_2c8._4_4_ != 1)) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x1233,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
        pcVar26 = 
        "OpImageQuerySizeLod must only consume an \"Image\" operand whose type has its \"Sampled\" operand set to 1"
        ;
        lVar25 = 0x66;
        goto LAB_006720e1;
      }
      uVar14 = ValidationState_t::GetDimension(_,uVar14);
      if (uVar14 == uVar15) {
        uVar14 = ValidationState_t::GetOperandTypeId(_,inst,3);
        bVar6 = ValidationState_t::IsIntScalarType(_,uVar14);
        if (bVar6) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Expected Level of Detail to be int scalar";
        goto LAB_00672460;
      }
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"Result Type has ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)local_278);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," components, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"but ",4);
      goto LAB_006731e1;
    }
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar26 = "Image \'MS\' must be 0";
LAB_006727db:
    lVar25 = 0x14;
    break;
  case OpImageQuerySize:
    uVar14 = (inst->inst_).type_id;
    bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14);
    if (!bVar6) goto LAB_00671f76;
    uVar15 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar10 = ValidationState_t::GetIdOpcode(_,uVar15);
    if (OVar10 != OpTypeImage) goto LAB_00671f4d;
    local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2d8._8_8_ = 0;
    uStack_2c8 = (code *)0x0;
    local_2c0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar15,(ImageTypeInfo *)&local_2d8);
    if (!bVar6) goto LAB_00672a86;
    if (5 < (uint)local_2d8._4_4_) {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Image \'Dim\' must be 1D, Buffer, 2D, Cube, 3D or Rect";
      goto LAB_00671f95;
    }
    if ((0x1aU >> (local_2d8._4_4_ & 0x1f) & 1) == 0) {
      iVar8 = 1;
      if ((0x21U >> (local_2d8._4_4_ & 0x1f) & 1) != 0) goto LAB_00672c3b;
      uVar15 = local_2d8._12_4_ + 3;
LAB_0067312e:
      if (((uint)uStack_2c8 != 1) && (((ulong)uStack_2c8 & 0xfffffffd00000000) != 0)) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Image must have either \'MS\'=1 or \'Sampled\'=0 or \'Sampled\'=2";
        goto LAB_0067315d;
      }
    }
    else {
      iVar8 = 2;
LAB_00672c3b:
      uVar15 = iVar8 + local_2d8._12_4_;
      if ((uint)local_2d8._4_4_ < 4) goto LAB_0067312e;
    }
    uVar14 = ValidationState_t::GetDimension(_,uVar14);
    if (uVar14 == uVar15) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Result Type has ",0x10)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," components, ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"but ",4);
LAB_006731e1:
    std::ostream::_M_insert<unsigned_long>((ulong)local_278);
    pcVar26 = " expected";
    lVar25 = 9;
    break;
  case OpImageQueryLod:
    pFVar17 = ValidationState_t::function(_,inst->function_->id_);
    local_2d8._M_unused._M_object = (_func_void *)0x0;
    local_2d8._8_8_ = 0;
    local_2c0 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2029:11)>
                ::_M_invoke;
    uStack_2c8 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2029:11)>
                 ::_M_manager;
    p_Var18 = std::__cxx11::
              list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
              ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                          *)&pFVar17->execution_model_limitations_,
                         (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_2d8);
    std::__detail::_List_node_base::_M_hook(&p_Var18->super__List_node_base);
    psVar1 = &(pFVar17->execution_model_limitations_).
              super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (uStack_2c8 != (code *)0x0) {
      (*uStack_2c8)(&local_2d8,&local_2d8,3);
    }
    pFVar17 = ValidationState_t::function(_,inst->function_->id_);
    local_2b8._M_unused._M_object = (_func_void *)0x0;
    local_2b8._8_8_ = 0;
    local_2a0 = std::
                _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2044:28)>
                ::_M_invoke;
    local_2a8 = std::
                _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2044:28)>
                ::_M_manager;
    p_Var19 = std::__cxx11::
              list<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>,std::allocator<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>>>
              ::
              _M_create_node<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>,std::allocator<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>>>
                          *)&pFVar17->limitations_,
                         (function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_2b8);
    std::__detail::_List_node_base::_M_hook(&p_Var19->super__List_node_base);
    psVar1 = &(pFVar17->limitations_).
              super__List_base<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_2a8 != (code *)0x0) {
      (*local_2a8)(&local_2b8,&local_2b8,3);
    }
    uVar14 = (inst->inst_).type_id;
    bVar6 = ValidationState_t::IsFloatVectorType(_,uVar14);
    if (bVar6) {
      uVar14 = ValidationState_t::GetDimension(_,uVar14);
      if (uVar14 != 2) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Expected Result Type to have 2 components";
        goto LAB_00672460;
      }
      uVar14 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar10 = ValidationState_t::GetIdOpcode(_,uVar14);
      if (OVar10 != OpTypeSampledImage) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Expected Image operand to be of type OpTypeSampledImage";
        goto LAB_00671816;
      }
      local_298._M_p = (char *)0x7fffffff00000000;
      local_290 = 0;
      aStack_288._M_allocated_capacity = 0;
      aStack_288._8_4_ = ImageFormatMax;
      aStack_288._12_4_ = AccessQualifierMax;
      bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar14,(ImageTypeInfo *)&local_298);
      if (!bVar6) goto LAB_00672a86;
      if (Cube < local_298._M_p._4_4_) goto LAB_00671df6;
      uVar14 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar6 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
      bVar7 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar14);
      if (!bVar6) {
        if (!bVar7) goto LAB_00673329;
LAB_006732b2:
        uVar15 = anon_unknown_0::GetPlaneCoordSize((ImageTypeInfo *)((ulong)local_298._M_p >> 0x20))
        ;
        uVar14 = ValidationState_t::GetDimension(_,uVar14);
        if (uVar15 <= uVar14) {
          return SPV_SUCCESS;
        }
        goto LAB_006732d3;
      }
      if ((bVar7) || (bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14), bVar6))
      goto LAB_006732b2;
LAB_00672e6f:
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Expected Coordinate to be int or float scalar or vector";
      goto LAB_00671816;
    }
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar26 = "Expected Result Type to be float vector type";
LAB_00672384:
    lVar25 = 0x2c;
    break;
  case OpImageQueryLevels:
  case OpImageQuerySamples:
    bVar6 = ValidationState_t::IsIntScalarType(_,(inst->inst_).type_id);
    if (!bVar6) goto LAB_0067176c;
    uVar14 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar10 = ValidationState_t::GetIdOpcode(_,uVar14);
    if (OVar10 != OpTypeImage) goto LAB_00671f4d;
    local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2d8._8_8_ = 0;
    uStack_2c8 = (code *)0x0;
    local_2c0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar14,(ImageTypeInfo *)&local_2d8);
    if (!bVar6) goto LAB_00672a86;
    uVar3 = (inst->inst_).opcode;
    if (uVar3 == 0x6b) {
      if (local_2d8._4_4_ == 1) {
        if ((uint)uStack_2c8 == 1) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Image \'MS\' must be 1";
        goto LAB_006727db;
      }
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar26 = "Image \'Dim\' must be 2D";
      lVar25 = 0x16;
      break;
    }
    if (uVar3 != 0x6a) {
      __assert_fail("opcode == spv::Op::OpImageQuerySamples",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                    ,0x87c,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageQueryLevelsOrSamples(ValidationState_t &, const Instruction *)"
                   );
    }
    if (3 < (uint)local_2d8._4_4_) goto LAB_00671df6;
    bVar6 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar6) {
      return SPV_SUCCESS;
    }
    if (uStack_2c8._4_4_ == 1) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x1233,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
    pcVar26 = 
    "OpImageQueryLevels must only consume an \"Image\" operand whose type has its \"Sampled\" operand set to 1"
    ;
    lVar25 = 0x65;
LAB_006720e1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar26,lVar25);
    pcVar27 = local_2a8;
    uVar28 = local_2b8._M_unused._0_8_;
    sVar12 = local_a8;
    if ((undefined8 *)local_2b8._M_unused._0_8_ != &local_2a8) {
LAB_006729e4:
      operator_delete((void *)uVar28,(ulong)(pcVar27 + 1));
      sVar12 = local_a8;
    }
    goto LAB_00672abc;
  default:
    if (OVar10 != OpTypeImage) {
      if (OVar10 != OpTypeSampledImage) {
        return SPV_SUCCESS;
      }
      uVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[2];
      OVar10 = ValidationState_t::GetIdOpcode(_,uVar14);
      if (OVar10 != OpTypeImage) goto LAB_00671f4d;
      local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
      local_2d8._8_8_ = 0;
      uStack_2c8 = (code *)0x0;
      local_2c0 = (code *)0x7fffffff7fffffff;
      bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar14,(ImageTypeInfo *)&local_2d8);
      if (!bVar6) goto LAB_00672a86;
      if (1 < uStack_2c8._4_4_) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x1231,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
        pcVar26 = "Sampled image type requires an image type with \"Sampled\" operand set to 0 or 1"
        ;
        lVar25 = 0x4e;
        goto LAB_006720e1;
      }
      if (_->version_ < 0x10600) {
        return SPV_SUCCESS;
      }
      if (local_2d8._4_4_ != 5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_ID,inst);
      pcVar26 = "In SPIR-V 1.6 or later, sampled image dimension must not be Buffer";
LAB_00672693:
      lVar25 = 0x42;
      break;
    }
    if ((inst->inst_).type_id != 0) {
      __assert_fail("inst->type_id() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                    ,0x307,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateTypeImage(ValidationState_t &, const Instruction *)"
                   );
    }
    local_2d8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2d8._8_8_ = 0;
    uStack_2c8 = (code *)0x0;
    local_2c0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo
                      (_,(inst->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[1],(ImageTypeInfo *)&local_2d8);
    if (!bVar6) goto LAB_00672a86;
    bVar6 = ValidationState_t::IsIntScalarType(_,local_2d8._0_4_);
    if (bVar6) {
      uVar14 = ValidationState_t::GetBitWidth(_,local_2d8._0_4_);
      if ((uVar14 == 0x40) &&
         (bVar6 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityInt64ImageEXT), !bVar6)) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Capability Int64ImageEXT is required when using Sampled Type of 64-bit int";
        lVar25 = 0x4a;
        break;
      }
    }
    sVar4 = _->context_->target_env;
    bVar6 = spvIsVulkanEnv(sVar4);
    if (bVar6) {
      bVar6 = ValidationState_t::IsFloatScalarType(_,local_2d8._0_4_);
      if (!bVar6) {
        bVar6 = ValidationState_t::IsIntScalarType(_,local_2d8._0_4_);
        if (bVar6) goto LAB_00672050;
LAB_00672097:
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x1230,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
        pcVar26 = 
        "Expected Sampled Type to be a 32-bit int, 64-bit int or 32-bit float scalar type for Vulkan environment"
        ;
        lVar25 = 0x67;
        goto LAB_006720e1;
      }
LAB_00672050:
      uVar14 = ValidationState_t::GetBitWidth(_,local_2d8._0_4_);
      if (uVar14 != 0x20) {
        uVar14 = ValidationState_t::GetBitWidth(_,local_2d8._0_4_);
        if (uVar14 != 0x40) goto LAB_00672097;
      }
      uVar14 = ValidationState_t::GetBitWidth(_,local_2d8._0_4_);
      if (uVar14 == 0x40) {
        bVar6 = ValidationState_t::IsFloatScalarType(_,local_2d8._0_4_);
        if (bVar6) goto LAB_00672097;
      }
    }
    else {
      bVar6 = spvIsOpenCLEnv(sVar4);
      if (bVar6) {
        bVar6 = ValidationState_t::IsVoidType(_,local_2d8._0_4_);
        if (!bVar6) {
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar26 = "Sampled Type must be OpTypeVoid in the OpenCL environment.";
          lVar25 = 0x3a;
          break;
        }
      }
      else {
        OVar10 = ValidationState_t::GetIdOpcode(_,local_2d8._0_4_);
        if ((OpTypeFloat < OVar10) || ((0x680000U >> (OVar10 & OpTypeOpaque) & 1) == 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"Expected Sampled Type to be either void or",0x2a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278," numerical scalar type",0x16);
          sVar9 = local_a8;
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_278);
        }
        if (OpTypeFloat < OVar10) {
          return sVar9;
        }
        if ((0x680000U >> (OVar10 & OpTypeOpaque) & 1) == 0) {
          return sVar9;
        }
      }
    }
    if (2 < (uint)local_2d8._8_4_) {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Invalid Depth ",0xe);
LAB_006727cc:
      std::ostream::_M_insert<unsigned_long>((ulong)local_278);
      pcVar26 = " (must be 0, 1 or 2)";
      goto LAB_006727db;
    }
    if ((uint)local_2d8._12_4_ < 2) {
      if (1 < (uint)uStack_2c8) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Invalid MS ",0xb);
        goto LAB_00672d3e;
      }
      if (2 < uStack_2c8._4_4_) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Invalid Sampled ",0x10);
        goto LAB_006727cc;
      }
      if (local_2d8._4_4_ == 0x104d) {
        bVar6 = ValidationState_t::IsVoidType(_,local_2d8._0_4_);
        if (bVar6) {
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar26 = "Dim TileImageDataEXT requires Sampled Type to be not OpTypeVoid";
          lVar25 = 0x3f;
        }
        else {
          if (uStack_2c8._4_4_ == 2) {
            if ((int)local_2c0 != 0) {
              ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar26 = "Dim TileImageDataEXT requires format Unknown";
              goto LAB_00672384;
            }
            if (local_2d8._8_4_ != 0) {
              ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar26 = "Dim TileImageDataEXT requires Depth to be 0";
              goto LAB_006722ea;
            }
            if (local_2d8._12_4_ == 0) goto LAB_00673899;
            ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar26 = "Dim TileImageDataEXT requires Arrayed to be 0";
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar26 = "Dim TileImageDataEXT requires Sampled to be 2";
          }
          lVar25 = 0x2d;
        }
        break;
      }
      if (local_2d8._4_4_ == 6) {
        if (uStack_2c8._4_4_ != 2) {
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x1846,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
          pcVar26 = "Dim SubpassData requires Sampled to be 2";
          lVar25 = 0x28;
          goto LAB_006720e1;
        }
        if ((int)local_2c0 != 0) {
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar26 = "Dim SubpassData requires format Unknown";
          goto LAB_00671874;
        }
      }
      else if ((uStack_2c8._4_4_ == 2 && (uint)uStack_2c8 != 0) &&
              (bVar6 = EnumSet<spv::Capability>::contains
                                 (&_->module_capabilities_,CapabilityStorageImageMultisample),
              !bVar6)) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = 
        "Capability StorageImageMultisample is required when using multisampled storage image";
        lVar25 = 0x54;
        break;
      }
LAB_00673899:
      bVar6 = spvIsOpenCLEnv(sVar4);
      if (!bVar6) {
LAB_006740ca:
        bVar6 = spvIsVulkanEnv(sVar4);
        if (!bVar6) {
          return SPV_SUCCESS;
        }
        if (uStack_2c8._4_4_ == 0) {
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x1231,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
          pcVar26 = "Sampled must be 1 or 2 in the Vulkan environment.";
          lVar25 = 0x31;
        }
        else {
          if ((local_2d8._4_4_ == 6) && (local_2d8._12_4_ != 0)) {
            ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x1846,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
            pcVar26 = "Dim SubpassData requires Arrayed to be 0 in the Vulkan environment";
            goto LAB_006719e3;
          }
          if (local_2d8._4_4_ != 4) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2b8,_,0x25a6,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,(char *)local_2b8._M_unused._0_8_,local_2b8._8_8_);
          pcVar26 = "Dim must not be Rect in the Vulkan environment";
          lVar25 = 0x2e;
        }
        goto LAB_006720e1;
      }
      if ((local_2d8._12_4_ == 1) && (1 < (uint)local_2d8._4_4_)) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"In the OpenCL environment, Arrayed may only be set to 1 ",
                   0x38);
        pcVar26 = "when Dim is either 1D or 2D.";
        lVar25 = 0x1c;
        break;
      }
      if ((uint)uStack_2c8 != 0) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "MS must be 0 in the OpenCL environment.";
        goto LAB_00671874;
      }
      if (uStack_2c8._4_4_ != 0) {
        ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar26 = "Sampled must be 0 in the OpenCL environment.";
        goto LAB_00672384;
      }
      if (local_2c0._4_4_ != 0x7fffffff) goto LAB_006740ca;
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"In the OpenCL environment, the optional Access Qualifier",
                 0x38);
      pcVar26 = " must be present.";
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"Invalid Arrayed ",0x10);
LAB_00672d3e:
      std::ostream::_M_insert<unsigned_long>((ulong)local_278);
      pcVar26 = " (must be 0 or 1)";
    }
    lVar25 = 0x11;
  }
LAB_00672aaa:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar26,lVar25);
  sVar12 = local_a8;
LAB_00672abc:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_278);
switchD_00670eda_caseD_3d:
  return sVar12;
switchD_00670f7a_caseD_13c:
  bVar6 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
  if (!bVar6) {
    ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar26 = "Expected Result Type to be bool scalar type";
LAB_006722ea:
    lVar25 = 0x2b;
    goto LAB_00672aaa;
  }
  uVar14 = ValidationState_t::GetOperandTypeId(_,inst,2);
  bVar6 = ValidationState_t::IsIntScalarType(_,uVar14);
  if (bVar6) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag((DiagnosticStream *)local_278,_,SPV_ERROR_INVALID_DATA,inst);
  pcVar26 = "Expected Resident Code to be int scalar";
LAB_00671874:
  lVar25 = 0x27;
  goto LAB_00672aaa;
}

Assistant:

spv_result_t ImagePass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  if (IsImplicitLod(opcode)) {
    _.function(inst->function()->id())
        ->RegisterExecutionModelLimitation([opcode](spv::ExecutionModel model,
                                                    std::string* message) {
          if (model != spv::ExecutionModel::Fragment &&
              model != spv::ExecutionModel::GLCompute &&
              model != spv::ExecutionModel::MeshEXT &&
              model != spv::ExecutionModel::TaskEXT) {
            if (message) {
              *message =
                  std::string(
                      "ImplicitLod instructions require Fragment, GLCompute, "
                      "MeshEXT or TaskEXT execution model: ") +
                  spvOpcodeString(opcode);
            }
            return false;
          }
          return true;
        });
    _.function(inst->function()->id())
        ->RegisterLimitation([opcode](const ValidationState_t& state,
                                      const Function* entry_point,
                                      std::string* message) {
          const auto* models = state.GetExecutionModels(entry_point->id());
          const auto* modes = state.GetExecutionModes(entry_point->id());
          if (models &&
              (models->find(spv::ExecutionModel::GLCompute) != models->end() ||
               models->find(spv::ExecutionModel::MeshEXT) != models->end() ||
               models->find(spv::ExecutionModel::TaskEXT) != models->end()) &&
              (!modes ||
               (modes->find(spv::ExecutionMode::DerivativeGroupLinearKHR) ==
                    modes->end() &&
                modes->find(spv::ExecutionMode::DerivativeGroupQuadsKHR) ==
                    modes->end()))) {
            if (message) {
              *message = std::string(
                             "ImplicitLod instructions require "
                             "DerivativeGroupQuadsKHR "
                             "or DerivativeGroupLinearKHR execution mode for "
                             "GLCompute, "
                             "MeshEXT or TaskEXT execution model: ") +
                         spvOpcodeString(opcode);
            }
            return false;
          }
          return true;
        });
  }

  switch (opcode) {
    case spv::Op::OpTypeImage:
      return ValidateTypeImage(_, inst);
    case spv::Op::OpTypeSampledImage:
      return ValidateTypeSampledImage(_, inst);
    case spv::Op::OpSampledImage:
      return ValidateSampledImage(_, inst);
    case spv::Op::OpImageTexelPointer:
      return ValidateImageTexelPointer(_, inst);

    case spv::Op::OpImageSampleImplicitLod:
    case spv::Op::OpImageSampleExplicitLod:
    case spv::Op::OpImageSampleProjImplicitLod:
    case spv::Op::OpImageSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleImplicitLod:
    case spv::Op::OpImageSparseSampleExplicitLod:
      return ValidateImageLod(_, inst);

    case spv::Op::OpImageSampleDrefImplicitLod:
    case spv::Op::OpImageSampleDrefExplicitLod:
    case spv::Op::OpImageSampleProjDrefImplicitLod:
    case spv::Op::OpImageSampleProjDrefExplicitLod:
    case spv::Op::OpImageSparseSampleDrefImplicitLod:
    case spv::Op::OpImageSparseSampleDrefExplicitLod:
      return ValidateImageDrefLod(_, inst);

    case spv::Op::OpImageFetch:
    case spv::Op::OpImageSparseFetch:
      return ValidateImageFetch(_, inst);

    case spv::Op::OpImageGather:
    case spv::Op::OpImageDrefGather:
    case spv::Op::OpImageSparseGather:
    case spv::Op::OpImageSparseDrefGather:
      return ValidateImageGather(_, inst);

    case spv::Op::OpImageRead:
    case spv::Op::OpImageSparseRead:
      return ValidateImageRead(_, inst);

    case spv::Op::OpImageWrite:
      return ValidateImageWrite(_, inst);

    case spv::Op::OpImage:
      return ValidateImage(_, inst);

    case spv::Op::OpImageQueryFormat:
    case spv::Op::OpImageQueryOrder:
      return ValidateImageQueryFormatOrOrder(_, inst);

    case spv::Op::OpImageQuerySizeLod:
      return ValidateImageQuerySizeLod(_, inst);
    case spv::Op::OpImageQuerySize:
      return ValidateImageQuerySize(_, inst);
    case spv::Op::OpImageQueryLod:
      return ValidateImageQueryLod(_, inst);

    case spv::Op::OpImageQueryLevels:
    case spv::Op::OpImageQuerySamples:
      return ValidateImageQueryLevelsOrSamples(_, inst);

    case spv::Op::OpImageSparseSampleProjImplicitLod:
    case spv::Op::OpImageSparseSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefImplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefExplicitLod:
      return ValidateImageSparseLod(_, inst);

    case spv::Op::OpImageSparseTexelsResident:
      return ValidateImageSparseTexelsResident(_, inst);

    case spv::Op::OpImageSampleWeightedQCOM:
    case spv::Op::OpImageBoxFilterQCOM:
    case spv::Op::OpImageBlockMatchSSDQCOM:
    case spv::Op::OpImageBlockMatchSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSSDQCOM:
    case spv::Op::OpImageBlockMatchGatherSADQCOM:
    case spv::Op::OpImageBlockMatchGatherSSDQCOM:
      return ValidateImageProcessingQCOM(_, inst);

    default:
      break;
  }

  return SPV_SUCCESS;
}